

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O0

void burstsortL(uchar **strings,size_t scnt)

{
  LIST *list;
  TRIE *root_00;
  uint uVar1;
  uint local_2c;
  uint i;
  LIST *listnodes;
  TRIE *root;
  size_t scnt_local;
  uchar **strings_local;
  
  list = (LIST *)calloc(scnt,0x10);
  local_2c = (uint)scnt;
  while (uVar1 = local_2c - 1, local_2c != 0) {
    list[uVar1].word = strings[uVar1];
    local_2c = uVar1;
  }
  root_00 = (TRIE *)calloc(1,0xc00);
  burstinsertL(root_00,list,scnt);
  bursttraverseL(root_00,strings,0,0);
  free(list);
  return;
}

Assistant:

void
burstsortL(unsigned char *strings[], size_t scnt)
{
    TRIE	*root;
    LIST	*listnodes;
    unsigned int i;

    listnodes = (LIST *) calloc(scnt, sizeof(LIST));

    for( i=scnt; i-- ;)
        listnodes[i].word = strings[i];

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertL(root, listnodes, scnt);

    (void) bursttraverseL(root, strings, 0, 0);

    free(listnodes);

    return;
}